

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fPath;
  uint fFadds;
  uint fAdders;
  char *pcVar5;
  long lVar6;
  
  fAdders = 0;
  Extra_UtilGetoptReset();
  fFadds = 0;
  fPath = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"afph"), iVar1 == 0x70) {
      fPath = fPath ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x66) {
      fFadds = fFadds ^ 1;
    }
    else {
      if (iVar1 != 0x61) {
        Abc_Print(-2,"usage: &show [-afph]\n");
        Abc_Print(-2,"\t        shows the current GIA using GSView\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fAdders == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (fFadds == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n",pcVar4
                 );
        if (fPath == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n",
                  pcVar5);
        pcVar4 = "\t-h    : print the command usage\n";
        iVar1 = -2;
LAB_0027750b:
        Abc_Print(iVar1,pcVar4);
        return 1;
      }
      fAdders = fAdders ^ 1;
    }
  }
  pGVar3 = pAbc->pGia;
  if (pGVar3 == (Gia_Man_t *)0x0) {
    pcVar4 = "Abc_CommandAbc9Show(): There is no AIG.\n";
  }
  else {
    if (pGVar3->nBufs == 0) {
      if ((fAdders == 0) && (pGVar3->vMapping != (Vec_Int_t *)0x0)) {
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 100;
        p->nSize = 0;
        piVar2 = (int *)malloc(400);
        p->pArray = piVar2;
        pGVar3 = pAbc->pGia;
        if (1 < pGVar3->nObjs) {
          lVar6 = 1;
          do {
            if (pGVar3->vMapping->nSize <= lVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pGVar3->vMapping->pArray[lVar6] != 0) {
              Vec_IntPush(p,(int)lVar6);
            }
            lVar6 = lVar6 + 1;
            pGVar3 = pAbc->pGia;
          } while (lVar6 < pGVar3->nObjs);
        }
      }
      else {
        p = (Vec_Int_t *)0x0;
      }
      Gia_ManShow(pAbc->pGia,p,fAdders,fFadds,fPath);
      if (p == (Vec_Int_t *)0x0) {
        return 0;
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      return 0;
    }
    pcVar4 = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
  }
  iVar1 = -1;
  goto LAB_0027750b;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0, fFadds = 0, fPath = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "afph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'f':
            fFadds ^= 1;
            break;
        case 'p':
            fPath ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders, fFadds, fPath );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-afph]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n", fFadds? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}